

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void readDHT(FILE *f)

{
  byte bVar1;
  uchar uVar2;
  uchar auVar3 [1];
  uint uVar4;
  int iVar5;
  pair<unsigned_char,_unsigned_int> *__ptr;
  mapped_type *pmVar6;
  ulong uVar7;
  char *__format;
  int i;
  long lVar8;
  ulong uVar9;
  uchar v_1;
  uchar v [1];
  uchar a [16];
  
  uVar4 = EnterNewSection(f,"DHT");
  for (iVar5 = uVar4 - 2; iVar5 != 0; iVar5 = (iVar5 - uVar4) + -0x11) {
    fread(v,1,1,(FILE *)f);
    auVar3[0] = v[0];
    __format = "AC\n";
    if (v[0] < 0x10) {
      __format = "DC\n";
    }
    printf(__format);
    printf(anon_var_dwarf_2ea2 + 9);
    fread(a,1,0x10,(FILE *)f);
    uVar7 = 0;
    for (lVar8 = 0; uVar4 = (uint)uVar7, lVar8 != 0x10; lVar8 = lVar8 + 1) {
      bVar1 = a[lVar8];
      printf("%d ",(ulong)bVar1);
      uVar7 = (ulong)(uVar4 + bVar1);
    }
    putchar(10);
    __ptr = createHuffCode(a,uVar4);
    for (lVar8 = 0; uVar7 << 3 != lVar8; lVar8 = lVar8 + 8) {
      fread(&v_1,1,1,(FILE *)f);
      uVar2 = v_1;
      uVar9 = (ulong)v_1;
      pmVar6 = std::
               map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
               ::operator[](huffTable[auVar3[0] >> 4] + (auVar3[0] & 0xf),
                            (key_type *)(&__ptr->first + lVar8));
      *pmVar6 = uVar2;
      printf("%d %d: %d\n",(ulong)(&__ptr->first)[lVar8],
             (ulong)*(uint *)((long)&__ptr->second + lVar8),uVar9);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void readDHT(FILE *f) {
    unsigned int len = EnterNewSection(f, "DHT");
    len -= 2;
    while (len > 0) {
        unsigned char v[1];
        fread(v, 1, 1, f);
        unsigned char DCorAC = v[0] >> 4;
        printf(DCorAC == 0 ? "DC\n" : "AC\n");
        unsigned char id = v[0] & 0x0F;
        printf("ID: %d\n", id);

        unsigned char a[16];
        fread(a, 1, 16, f);
        unsigned int number = 0;
        for (int i = 0; i < 16; i++) {
            printf("%d ", a[i]);
            number += a[i];
        }
        printf("\n");
        auto huffCode = createHuffCode(a, number);
        for (int i = 0; i < number; i++) {
            unsigned char v;
            fread(&v, 1, 1, f);
            huffTable[DCorAC][id][huffCode[i]] = v;
            printf("%d %d: %d\n", huffCode[i].first, huffCode[i].second, v);
        }
        free(huffCode);

        len -= (1 + 16 + number);
    }
}